

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall
streams_tests::streams_vector_reader_rvalue::test_method(streams_vector_reader_rvalue *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  uint *puVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  initializer_list<unsigned_char> __l;
  const_string file;
  const_string file_00;
  assertion_result *__a;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  assertion_result local_e8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  uint local_7c;
  SpanReader reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  lazy_ostream local_50;
  undefined1 *local_40;
  char **local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._vptr_lazy_ostream = (_func_int **)CONCAT53(local_50._vptr_lazy_ostream._3_5_,0x31a782);
  __a = &local_e8;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_50;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,__l,(allocator_type *)__a);
  reader.m_data.m_size =
       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  reader.m_data.m_data =
       data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_7c = ReadVarInt<SpanReader,(VarIntMode)0,unsigned_int>(&reader);
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xb6;
  file.m_begin = (iterator)&local_90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a0,msg);
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_38 = (char **)0xc694e1;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_a8 = "";
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x31;
  local_e8._1_3_ = 0xd4;
  pvVar1 = (iterator)0x2;
  puVar2 = &local_7c;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_50,&local_b0,0xb6,1,2,puVar2,"varint",__a,"54321U");
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)puVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0xb7;
  file_00.m_begin = (iterator)&local_c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(reader.m_data.m_size == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_38 = &local_f8;
  local_f8 = "reader.empty()";
  local_f0 = "";
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_100 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_50,1,0,WARN,(check_type)__a,(size_t)&local_108,0xb7);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_vector_reader_rvalue)
{
    std::vector<uint8_t> data{0x82, 0xa7, 0x31};
    SpanReader reader{data};
    uint32_t varint = 0;
    // Deserialize into r-value
    reader >> VARINT(varint);
    BOOST_CHECK_EQUAL(varint, 54321U);
    BOOST_CHECK(reader.empty());
}